

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O0

int replacePic(istream *in,ostream *output,path *replacementFile)

{
  Size section;
  Point point;
  undefined2 uVar1;
  undefined2 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  int *piVar7;
  reference pvVar8;
  size_type sVar9;
  _Node_iterator_base<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_true> __n;
  pointer ppVar10;
  reference pCVar11;
  char *in_RSI;
  void *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<Image,_pair<unsigned_int,_unsigned_int>_>_&&>::value,_pair<iterator,_bool>_>
  _Var12;
  ChunkData *chunk_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ChunkData,_std::allocator<ChunkData>_> *__range1_1;
  value_type *chunkEntry;
  MaskRect bounds;
  iterator found;
  value_type *headerEntry;
  Point shrink;
  int width;
  int x1;
  int height;
  int y1;
  int headerIdx;
  Image chunk;
  int pos;
  Size sizeInChunks;
  vector<PicChunk,_std::allocator<PicChunk>_> chunkEntries;
  vector<ChunkData,_std::allocator<ChunkData>_> data;
  Image replacement;
  Compressor compressor;
  unordered_map<Image,_std::pair<unsigned_int,_unsigned_int>,_image_hash,_std::equal_to<Image>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  seen;
  PicChunk *chunk_1;
  iterator __end1;
  iterator __begin1;
  vector<PicChunk,_std::allocator<PicChunk>_> *__range1;
  int CHUNK_HEIGHT;
  int CHUNK_WIDTH;
  PicHeader header;
  uint in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  Size in_stack_fffffffffffffd10;
  pair<Image,_std::pair<unsigned_int,_unsigned_int>_> *in_stack_fffffffffffffd18;
  char *pcVar13;
  ChunkHeader *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  Image *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  Color base;
  Size in_stack_fffffffffffffd40;
  ChunkHeader *header_00;
  undefined4 in_stack_fffffffffffffd80;
  __normal_iterator<ChunkData_*,_std::vector<ChunkData,_std::allocator<ChunkData>_>_> local_260;
  undefined1 *local_258;
  _Node_iterator_base<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_true>
  local_250;
  undefined1 in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdb9;
  Image *in_stack_fffffffffffffde0;
  Image *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  Point in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  path *in_stack_fffffffffffffe08;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe10;
  Compressor *in_stack_fffffffffffffe18;
  Point in_stack_fffffffffffffe20;
  MaskRect in_stack_fffffffffffffe28;
  _Node_iterator_base<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_true>
  local_1a8;
  _Node_iterator_base<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_true>
  local_1a0;
  reference local_198;
  Point local_190;
  int local_188;
  int iStack_184;
  int local_180;
  uint uStack_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  int iStack_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  uint local_154;
  int local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined2 local_140;
  undefined2 local_13c;
  uint32_t local_11c;
  Size local_118 [4];
  undefined1 local_f8 [24];
  int local_e0;
  int local_dc;
  reference local_80;
  PicChunk *local_78;
  __normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_> local_70;
  undefined1 *local_68;
  uint local_5c;
  uint local_58 [4];
  undefined1 local_48 [56];
  char *local_10;
  void *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  PicHeader::PicHeader((PicHeader *)0x122b74);
  operator>>((istream *)in_stack_fffffffffffffd10,
             (PicHeader *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  local_58[0] = 0x400;
  local_5c = 0x400;
  local_68 = local_48 + 0x18;
  local_70._M_current =
       (PicChunk *)
       std::vector<PicChunk,_std::allocator<PicChunk>_>::begin
                 ((vector<PicChunk,_std::allocator<PicChunk>_> *)
                  CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  local_78 = (PicChunk *)
             std::vector<PicChunk,_std::allocator<PicChunk>_>::end
                       ((vector<PicChunk,_std::allocator<PicChunk>_> *)
                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>
                        *)in_stack_fffffffffffffd10,
                       (__normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    base = SUB84((ulong)in_stack_fffffffffffffd38 >> 0x20,0);
    if (!bVar3) break;
    local_80 = __gnu_cxx::
               __normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>::
               operator*(&local_70);
    if ((0x40 < local_80->x) && ((int)(uint)local_80->x < (int)local_58[0])) {
      local_58[0] = (uint)local_80->x;
    }
    if ((0x40 < local_80->y) && ((int)(uint)local_80->y < (int)local_5c)) {
      local_5c = (uint)local_80->y;
    }
    __gnu_cxx::__normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>::
    operator++(&local_70);
  }
  printf("Using %dx%d chunks\n",(ulong)local_58[0],(ulong)local_5c);
  std::
  unordered_map<Image,_std::pair<unsigned_int,_unsigned_int>,_image_hash,_std::equal_to<Image>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  ::unordered_map((unordered_map<Image,_std::pair<unsigned_int,_unsigned_int>,_image_hash,_std::equal_to<Image>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *)0x122cdb);
  Compressor::Compressor((Compressor *)in_stack_fffffffffffffd30);
  Image::readPNG(in_stack_fffffffffffffe08);
  std::vector<ChunkData,_std::allocator<ChunkData>_>::vector
            ((vector<ChunkData,_std::allocator<ChunkData>_> *)0x122d0e);
  std::vector<PicChunk,_std::allocator<PicChunk>_>::vector
            ((vector<PicChunk,_std::allocator<PicChunk>_> *)0x122d1b);
  local_118[0].width = (int)(local_e0 + -1 + local_58[0]) / (int)local_58[0];
  __n._M_cur = (__node_type *)(ulong)local_5c;
  local_118[0].height = (int)(local_dc + -1 + local_5c) / (int)local_5c;
  header_00 = (ChunkHeader *)(local_48 + 0x18);
  iVar4 = Size::area(local_118);
  std::vector<PicChunk,_std::allocator<PicChunk>_>::resize
            ((vector<PicChunk,_std::allocator<PicChunk>_> *)in_stack_fffffffffffffd30,
             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
  sVar6 = PicHeader::binSize((PicHeader *)
                             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  local_11c = (uint32_t)sVar6;
  local_148 = 0;
  uStack_144 = 0;
  local_14c = 0;
  Image::Image(in_stack_fffffffffffffd30,in_stack_fffffffffffffd40,base);
  local_150 = 0;
  for (local_154 = 0; (int)local_154 < local_dc; local_154 = local_5c + local_154) {
    __n._M_cur = (__node_type *)(ulong)local_154;
    local_15c = local_dc - local_154;
    piVar7 = std::min<int>(&local_15c,(int *)&local_5c);
    local_158 = *piVar7;
    for (local_160 = 0; local_160 < local_e0; local_160 = local_58[0] + local_160) {
      local_168 = local_e0 - local_160;
      piVar7 = std::min<int>(&local_168,(int *)local_58);
      local_170 = *piVar7;
      iStack_16c = local_158;
      local_164 = local_170;
      Image::fastResize((Image *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                        in_stack_fffffffffffffd10);
      local_178 = 0;
      uStack_174 = 0;
      local_180 = local_160;
      uStack_17c = local_154;
      local_188 = local_164;
      iStack_184 = local_158;
      point.y._3_1_ = in_stack_fffffffffffffe07;
      point._0_7_ = in_stack_fffffffffffffe00;
      section.height = in_stack_fffffffffffffdf4;
      section.width = in_stack_fffffffffffffdf0;
      Image::drawOnto(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,point,
                      in_stack_fffffffffffffdf8,section);
      local_190 = shrinkChunk((Image *)CONCAT71(in_stack_fffffffffffffdb9,in_stack_fffffffffffffdb8)
                             );
      local_198 = std::vector<PicChunk,_std::allocator<PicChunk>_>::operator[]
                            ((vector<PicChunk,_std::allocator<PicChunk>_> *)(local_48 + 0x18),
                             (long)local_150);
      local_150 = local_150 + 1;
      local_198->x = (short)local_160 + (short)local_190.x;
      local_198->y = (short)local_154 + (short)local_190.y;
      local_1a0._M_cur =
           (__node_type *)
           std::
           unordered_map<Image,_std::pair<unsigned_int,_unsigned_int>,_image_hash,_std::equal_to<Image>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>_>
           ::find((unordered_map<Image,_std::pair<unsigned_int,_unsigned_int>,_image_hash,_std::equal_to<Image>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                  (key_type *)0x123008);
      local_1a8._M_cur =
           (__node_type *)
           std::
           unordered_map<Image,_std::pair<unsigned_int,_unsigned_int>,_image_hash,_std::equal_to<Image>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>_>
           ::end((unordered_map<Image,_std::pair<unsigned_int,_unsigned_int>,_image_hash,_std::equal_to<Image>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      bVar3 = std::__detail::operator==(&local_1a0,&local_1a8);
      uVar2 = local_13c;
      uVar1 = local_140;
      if (bVar3) {
        uVar5 = local_11c + 0xf;
        if ((int)(local_11c + 0xf) < 0) {
          uVar5 = local_11c + 0x1e;
        }
        local_11c = uVar5 & 0xfffffff0;
        std::vector<ChunkData,_std::allocator<ChunkData>_>::emplace_back<>
                  ((vector<ChunkData,_std::allocator<ChunkData>_> *)in_stack_fffffffffffffd10);
        pvVar8 = std::vector<ChunkData,_std::allocator<ChunkData>_>::back
                           ((vector<ChunkData,_std::allocator<ChunkData>_> *)
                            in_stack_fffffffffffffd10);
        in_stack_fffffffffffffdf8 = (Point)((ulong)CONCAT22(uVar2,uVar1) << 0x20);
        in_stack_fffffffffffffdf0 = 0;
        in_stack_fffffffffffffdf4 = 0;
        in_stack_fffffffffffffd08 = local_48[0] & 1;
        Compressor::encodeChunk
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                   (Image *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe28,
                   in_stack_fffffffffffffe20,(bool)in_stack_fffffffffffffe07);
        ChunkHeader::operator=
                  ((ChunkHeader *)in_stack_fffffffffffffd10,
                   (ChunkHeader *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        ChunkHeader::~ChunkHeader((ChunkHeader *)in_stack_fffffffffffffd10);
        pvVar8->offset = local_11c;
        local_198->offset = local_11c;
        sVar6 = ChunkHeader::calcAlignmentGetBinSize(in_stack_fffffffffffffd20);
        sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pvVar8->data);
        local_198->size = (int)sVar6 + (int)sVar9;
        std::make_pair<unsigned_int&,unsigned_int&>
                  ((uint *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                   (uint *)0x1231cd);
        std::make_pair<Image,std::pair<unsigned_int,unsigned_int>>
                  (&in_stack_fffffffffffffd18->first,
                   (pair<unsigned_int,_unsigned_int> *)in_stack_fffffffffffffd10);
        _Var12 = std::
                 unordered_map<Image,std::pair<unsigned_int,unsigned_int>,image_hash,std::equal_to<Image>,std::allocator<std::pair<Image_const,std::pair<unsigned_int,unsigned_int>>>>
                 ::insert<std::pair<Image,std::pair<unsigned_int,unsigned_int>>>
                           ((unordered_map<Image,_std::pair<unsigned_int,_unsigned_int>,_image_hash,_std::equal_to<Image>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        __n._M_cur = (__node_type *)
                     _Var12.first.
                     super__Node_iterator_base<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_true>
                     ._M_cur;
        in_stack_fffffffffffffdb8 = _Var12.second;
        local_250._M_cur = __n._M_cur;
        std::pair<Image,_std::pair<unsigned_int,_unsigned_int>_>::~pair
                  ((pair<Image,_std::pair<unsigned_int,_unsigned_int>_> *)0x123245);
        local_11c = local_198->size + local_11c;
      }
      else {
        ppVar10 = std::__detail::
                  _Node_iterator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_false,_true>
                  ::operator->((_Node_iterator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_false,_true>
                                *)0x1232fa);
        local_198->offset = (ppVar10->second).first;
        ppVar10 = std::__detail::
                  _Node_iterator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_false,_true>
                  ::operator->((_Node_iterator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_false,_true>
                                *)0x123315);
        uVar5 = (ppVar10->second).second;
        __n._M_cur = (__node_type *)(ulong)uVar5;
        local_198->size = uVar5;
      }
    }
  }
  local_48._4_4_ = local_11c;
  PicHeader::write((PicHeader *)local_48,(int)local_10,local_8,(size_t)__n._M_cur);
  local_258 = local_f8;
  local_260._M_current =
       (ChunkData *)
       std::vector<ChunkData,_std::allocator<ChunkData>_>::begin
                 ((vector<ChunkData,_std::allocator<ChunkData>_> *)
                  CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  std::vector<ChunkData,_std::allocator<ChunkData>_>::end
            ((vector<ChunkData,_std::allocator<ChunkData>_> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<ChunkData_*,_std::vector<ChunkData,_std::allocator<ChunkData>_>_>
                        *)in_stack_fffffffffffffd10,
                       (__normal_iterator<ChunkData_*,_std::vector<ChunkData,_std::allocator<ChunkData>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    if (!bVar3) break;
    pCVar11 = __gnu_cxx::
              __normal_iterator<ChunkData_*,_std::vector<ChunkData,_std::allocator<ChunkData>_>_>::
              operator*(&local_260);
    std::ostream::seekp((long)local_10,pCVar11->offset);
    operator<<((ostream *)CONCAT44(iVar4,in_stack_fffffffffffffd80),header_00);
    pcVar13 = local_10;
    in_stack_fffffffffffffd20 =
         (ChunkHeader *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x123448);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pCVar11->data);
    std::ostream::write(pcVar13,(long)in_stack_fffffffffffffd20);
    __gnu_cxx::__normal_iterator<ChunkData_*,_std::vector<ChunkData,_std::allocator<ChunkData>_>_>::
    operator++(&local_260);
  }
  Image::~Image((Image *)0x123493);
  std::vector<PicChunk,_std::allocator<PicChunk>_>::~vector
            ((vector<PicChunk,_std::allocator<PicChunk>_> *)in_stack_fffffffffffffd20);
  std::vector<ChunkData,_std::allocator<ChunkData>_>::~vector
            ((vector<ChunkData,_std::allocator<ChunkData>_> *)in_stack_fffffffffffffd20);
  Image::~Image((Image *)0x1234ba);
  Compressor::~Compressor((Compressor *)in_stack_fffffffffffffd10);
  std::
  unordered_map<Image,_std::pair<unsigned_int,_unsigned_int>,_image_hash,_std::equal_to<Image>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  ::~unordered_map((unordered_map<Image,_std::pair<unsigned_int,_unsigned_int>,_image_hash,_std::equal_to<Image>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                    *)0x1234d4);
  PicHeader::~PicHeader((PicHeader *)0x1234e1);
  return 0;
}

Assistant:

int replacePic(std::istream &in, std::ostream &output, const fs::path &replacementFile) {
	PicHeader header;
	in >> header;

	int CHUNK_WIDTH = 1024;
	int CHUNK_HEIGHT = 1024;

	for (const auto& chunk : header.chunks) {
		if (chunk.x > 64 && chunk.x < CHUNK_WIDTH) {
			CHUNK_WIDTH = chunk.x;
		}
		if (chunk.y > 64 && chunk.y < CHUNK_HEIGHT) {
			CHUNK_HEIGHT = chunk.y;
		}
	}

	printf("Using %dx%d chunks\n", CHUNK_WIDTH, CHUNK_HEIGHT);

	std::unordered_map<Image, std::pair<uint32_t, uint32_t>, image_hash> seen;

	Compressor compressor;
	Image replacement = Image::readPNG(replacementFile);
	struct ChunkData {
		ChunkHeader header;
		std::vector<uint8_t> data;
		uint32_t offset;
	};
	std::vector<ChunkData> data;
	std::vector<PicChunk> chunkEntries;
	Size sizeInChunks = {(replacement.size.width + CHUNK_WIDTH - 1) / CHUNK_WIDTH, (replacement.size.height + CHUNK_HEIGHT - 1) / CHUNK_HEIGHT};
	header.chunks.resize(sizeInChunks.area());
	int pos = header.binSize();
	Image chunk;
	int headerIdx = 0;
	for (int y1 = 0; y1 < replacement.size.height; y1 += CHUNK_HEIGHT) {
		int height = std::min(replacement.size.height - y1, CHUNK_HEIGHT);
		for (int x1 = 0; x1 < replacement.size.width; x1 += CHUNK_WIDTH) {
			int width = std::min(replacement.size.width - x1, CHUNK_WIDTH);
			chunk.fastResize({width, height});
			replacement.drawOnto(chunk, {0, 0}, {x1, y1}, {width, height});
			Point shrink = shrinkChunk(chunk);

			auto& headerEntry = header.chunks[headerIdx];
			headerIdx++;
			headerEntry.x = x1 + shrink.x;
			headerEntry.y = y1 + shrink.y;

			auto found = seen.find(chunk);
			if (found == seen.end()) {
				pos = (pos + 15) / 16 * 16;
				MaskRect bounds = {0, 0, static_cast<uint16_t>(chunk.size.width), static_cast<uint16_t>(chunk.size.height)};
				data.emplace_back();
				auto& chunkEntry = data.back();
				chunkEntry.header = compressor.encodeChunk(chunkEntry.data, chunk, bounds, {0, 0}, header.isSwitch);
				chunkEntry.offset = pos;

				headerEntry.offset = pos;
				headerEntry.size = chunkEntry.header.calcAlignmentGetBinSize() + chunkEntry.data.size();
				seen.insert(std::make_pair(std::move(chunk), std::make_pair(headerEntry.offset, headerEntry.size)));
				pos += headerEntry.size;
			} else {
				headerEntry.offset = found->second.first;
				headerEntry.size = found->second.second;
			}
		}
	}

	header.filesize = pos;
	header.write(output, in);
	for (auto& chunk : data) {
		output.seekp(chunk.offset, output.beg);
		output << chunk.header;
		output.write(reinterpret_cast<char*>(chunk.data.data()), chunk.data.size());
	}
	return 0;
}